

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O2

void __thiscall
cmMessenger::PrintBacktraceTitle(cmMessenger *this,ostream *out,cmListFileBacktrace *bt)

{
  bool bVar1;
  cmListFileContext *pcVar2;
  ostream *os;
  char *pcVar3;
  cmListFileContext lfc;
  string sStack_a8;
  cmListFileContext local_88;
  
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar1) {
    pcVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    cmListFileContext::cmListFileContext(&local_88,pcVar2);
    if ((this->TopSource).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      cmSystemTools::RelativeIfUnder(&sStack_a8,(string *)this,&local_88.FilePath);
      std::__cxx11::string::operator=((string *)&local_88.FilePath,(string *)&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
    }
    pcVar3 = " at ";
    if (local_88.Line == 0) {
      pcVar3 = " in ";
    }
    os = std::operator<<(out,pcVar3);
    ::operator<<(os,&local_88);
    cmListFileContext::~cmListFileContext(&local_88);
  }
  return;
}

Assistant:

void cmMessenger::PrintBacktraceTitle(std::ostream& out,
                                      cmListFileBacktrace const& bt) const
{
  // The title exists only if we have a call on top of the bottom.
  if (bt.Empty()) {
    return;
  }
  cmListFileContext lfc = bt.Top();
  if (this->TopSource) {
    lfc.FilePath =
      cmSystemTools::RelativeIfUnder(*this->TopSource, lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}